

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void vmsa_ttbcr_raw_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint64_t uVar5;
  
  lVar1 = ri->fieldoffset;
  uVar4 = (uint)env->features;
  uVar5 = value;
  if ((uVar4 >> 0x1b & 1) == 0) {
    uVar3 = (uint)value;
    if ((int)uVar3 < 0 && (uVar4 >> 0x1a & 1) != 0) {
      uVar5 = value & 0xffffffffffc73f87;
    }
    else if ((env->features >> 0x21 & 1) == 0) {
      uVar5 = (uint64_t)(uVar3 & 7);
    }
    else {
      uVar5 = (uint64_t)(uVar3 & 0x37);
    }
  }
  *(uint64_t *)((long)env->regs + lVar1) = uVar5;
  bVar2 = (byte)value & 7;
  *(uint *)((long)env->regs + lVar1 + 8) = ~(0xffffffffU >> bVar2);
  *(int *)((long)env->regs + lVar1 + 0xc) = -0x4000 >> bVar2;
  return;
}

Assistant:

static void vmsa_ttbcr_raw_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                 uint64_t value)
{
    TCR *tcr = raw_ptr(env, ri);
    int maskshift = extract32(value, 0, 3);

    if (!arm_feature(env, ARM_FEATURE_V8)) {
        if (arm_feature(env, ARM_FEATURE_LPAE) && (value & TTBCR_EAE)) {
            /* Pre ARMv8 bits [21:19], [15:14] and [6:3] are UNK/SBZP when
             * using Long-desciptor translation table format */
            value &= ~((7 << 19) | (3 << 14) | (0xf << 3));
        } else if (arm_feature(env, ARM_FEATURE_EL3)) {
            /* In an implementation that includes the Security Extensions
             * TTBCR has additional fields PD0 [4] and PD1 [5] for
             * Short-descriptor translation table format.
             */
            value &= TTBCR_PD1 | TTBCR_PD0 | TTBCR_N;
        } else {
            value &= TTBCR_N;
        }
    }

    /* Update the masks corresponding to the TCR bank being written
     * Note that we always calculate mask and base_mask, but
     * they are only used for short-descriptor tables (ie if EAE is 0);
     * for long-descriptor tables the TCR fields are used differently
     * and the mask and base_mask values are meaningless.
     */
    tcr->raw_tcr = value;
    tcr->mask = ~(((uint32_t)0xffffffffu) >> maskshift);
    tcr->base_mask = ~((uint32_t)0x3fffu >> maskshift);
}